

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O1

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  long *plVar1;
  char cVar2;
  curl_socket_t readfd0;
  SessionHandle *data;
  bool bVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  CHUNKcode CVar7;
  Curl_send_buffer *in;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  undefined8 extraout_RAX;
  char *pcVar12;
  char *pcVar13;
  byte bVar14;
  int iVar15;
  int iVar16;
  char *pcVar17;
  ulong uVar18;
  bool bVar19;
  CURLcode local_cc;
  size_t local_b0;
  char *local_a0;
  long local_90;
  ssize_t gotbytes;
  uint local_74;
  char *local_70;
  char *local_68;
  connectdata *local_60;
  int local_58;
  int subversion;
  ulong local_50;
  ssize_t tookcareof;
  int *local_40;
  long *local_38;
  
  subversion = 0;
  if (conn->tunnel_state[sockindex] != TUNNEL_COMPLETE) {
    data = conn->data;
    readfd0 = conn->sock[sockindex];
    (conn->bits).proxy_connect_closed = false;
    local_38 = &(data->info).request_size;
    local_70 = (data->state).buffer;
    local_40 = &(data->req).httpcode;
    iVar16 = 0;
    local_50 = 0;
    bVar3 = false;
    local_90 = 0;
    local_74 = remote_port;
    local_68 = hostname;
    local_58 = sockindex;
    do {
      if (conn->tunnel_state[sockindex] == TUNNEL_INIT) {
        Curl_infof(data,"Establish HTTP proxy tunnel to %s:%hu\n",local_68);
        pcVar8 = (data->req).newurl;
        if (pcVar8 != (char *)0x0) {
          (*Curl_cfree)(pcVar8);
          (data->req).newurl = (char *)0x0;
        }
        in = Curl_add_buffer_init();
        CVar5 = CURLE_OUT_OF_MEMORY;
        if (in == (Curl_send_buffer *)0x0) {
LAB_00492c5e:
          local_cc = CVar5;
          bVar19 = false;
        }
        else {
          pcVar8 = curl_maprintf("%s:%hu",local_68,(ulong)local_74);
          if (pcVar8 == (char *)0x0) {
            (*Curl_cfree)(in);
            local_cc = CURLE_OUT_OF_MEMORY;
LAB_00492c82:
            bVar19 = false;
          }
          else {
            CVar5 = Curl_http_output_auth(conn,"CONNECT",pcVar8,true);
            (*Curl_cfree)(pcVar8);
            if (CVar5 == CURLE_OK) {
              pcVar8 = "1.1";
              if (conn->proxytype == CURLPROXY_HTTP_1_0) {
                pcVar8 = "1.0";
              }
              bVar19 = (conn->bits).ipv6_ip != false;
              pcVar11 = "";
              if (bVar19) {
                pcVar11 = "[";
              }
              pcVar12 = "";
              if (bVar19) {
                pcVar12 = "]";
              }
              pcVar11 = curl_maprintf("%s%s%s:%hu",pcVar11,local_68,pcVar12,(ulong)local_74);
              if (pcVar11 == (char *)0x0) {
                (*Curl_cfree)(in);
LAB_00492c35:
                local_cc = CURLE_OUT_OF_MEMORY;
                bVar19 = false;
                CVar5 = CURLE_OK;
              }
              else {
                pcVar12 = Curl_checkProxyheaders(conn,"Host:");
                pcVar13 = "";
                if ((pcVar12 == (char *)0x0) &&
                   (pcVar13 = curl_maprintf("Host: %s\r\n"), pcVar13 == (char *)0x0)) {
                  (*Curl_cfree)(pcVar11);
                  (*Curl_cfree)(in);
                  goto LAB_00492c35;
                }
                pcVar12 = Curl_checkProxyheaders(conn,"Proxy-Connection:");
                pcVar17 = "";
                if (pcVar12 == (char *)0x0) {
                  pcVar17 = "Proxy-Connection: Keep-Alive\r\n";
                }
                pcVar9 = Curl_checkProxyheaders(conn,"User-Agent:");
                pcVar12 = "";
                if ((pcVar9 == (char *)0x0) && (pcVar12 = "", (data->set).str[0x19] != (char *)0x0))
                {
                  pcVar12 = (conn->allocptr).uagent;
                }
                pcVar9 = (conn->allocptr).proxyuserpwd;
                if (pcVar9 == (char *)0x0) {
                  pcVar9 = "";
                }
                CVar5 = Curl_add_bufferf(in,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar11,pcVar8,pcVar13,
                                         pcVar9,pcVar12,pcVar17);
                if (*pcVar13 != '\0') {
                  (*Curl_cfree)(pcVar13);
                }
                (*Curl_cfree)(pcVar11);
                if (CVar5 == CURLE_OK) {
                  CVar5 = Curl_add_custom_headers(conn,true,in);
                }
                if (CVar5 == CURLE_OK) {
                  CVar5 = Curl_add_bufferf(in,"\r\n");
                }
                if (CVar5 == CURLE_OK) {
                  CVar5 = Curl_add_buffer_send(in,conn,local_38,0,local_58);
                }
                bVar19 = true;
                if (CVar5 != CURLE_OK) {
                  Curl_failf(data,"Failed sending CONNECT to proxy");
                }
                in = (Curl_send_buffer *)0x0;
              }
              if (!bVar19) goto LAB_00492c82;
            }
            if (in != (Curl_send_buffer *)0x0) {
              (*Curl_cfree)(in);
            }
            if (CVar5 != CURLE_OK) goto LAB_00492c5e;
            conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
            bVar19 = true;
          }
        }
        if (!bVar19) {
          return local_cc;
        }
      }
      lVar10 = Curl_timeleft(data,(timeval *)0x0,true);
      if (lVar10 < 1) {
        Curl_failf(data,"Proxy CONNECT aborted due to timeout");
        return CURLE_RECV_ERROR;
      }
      iVar6 = Curl_socket_check(readfd0,-1,-1,0);
      if (iVar6 == 0) {
        return CURLE_OK;
      }
      bVar14 = 1;
      uVar18 = 0;
      local_b0 = 0;
      local_a0 = local_70;
      pcVar8 = local_70;
      do {
        if (((0x3fff < uVar18) || (bVar14 == 0)) || (iVar16 != 0)) {
LAB_00493418:
          iVar6 = 1;
          if (iVar16 != 0) {
            local_cc = CURLE_RECV_ERROR;
            goto LAB_004934b5;
          }
          if ((data->info).httpproxycode != 200) {
            CVar5 = Curl_http_auth_act(conn);
            if (CVar5 != CURLE_OK) {
              iVar16 = 0;
              local_cc = CVar5;
              goto LAB_00493456;
            }
            if ((conn->bits).close != false) {
              bVar3 = true;
            }
          }
          iVar16 = 0;
          if ((bVar3) && ((data->req).newurl != (char *)0x0)) {
            Curl_closesocket(conn,conn->sock[sockindex]);
            conn->sock[sockindex] = -1;
            iVar6 = 2;
          }
          else {
            iVar6 = 0;
          }
          goto LAB_004934b5;
        }
        do {
          lVar10 = Curl_timeleft(data,(timeval *)0x0,true);
          if (lVar10 < 1) {
            Curl_failf(data,"Proxy CONNECT aborted due to timeout");
            iVar16 = 2;
            goto LAB_00493418;
          }
          if (999 < lVar10) {
            lVar10 = 1000;
          }
          iVar6 = Curl_socket_check(readfd0,-1,-1,lVar10);
          if (iVar6 == 0) goto LAB_00492e0a;
          if (iVar6 == -1) {
            pcVar11 = "Proxy CONNECT aborted due to select/poll error";
            goto LAB_00492def;
          }
          CVar5 = Curl_read(conn,readfd0,pcVar8,0x4000 - uVar18,&gotbytes);
        } while (CVar5 == CURLE_AGAIN);
        if (CVar5 == CURLE_OK) {
          if (gotbytes < 1) {
            if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
              bVar14 = 0;
              pcVar11 = "Proxy CONNECT aborted";
LAB_00492def:
              Curl_failf(data,pcVar11);
              iVar16 = 1;
            }
            else {
              (conn->bits).proxy_connect_closed = true;
              bVar14 = 0;
              Curl_infof(data,"Proxy CONNECT connection closed");
            }
          }
          else {
            if (bVar14 < 2) {
              uVar18 = uVar18 + gotbytes;
              if (gotbytes < 1) {
                iVar6 = 0;
              }
              else {
                lVar10 = 0;
                iVar15 = 0;
                local_60 = conn;
                do {
                  local_b0 = (long)(int)local_b0 + 1;
                  if (*pcVar8 == '\n') {
                    if ((data->set).verbose == true) {
                      Curl_debug(data,CURLINFO_HEADER_IN,local_a0,(long)(int)local_b0,conn);
                    }
                    CVar5 = Curl_client_write(conn,(data->set).include_header | 2,local_a0,local_b0)
                    ;
                    conn = local_60;
                    plVar1 = &(data->info).header_size;
                    *plVar1 = *plVar1 + local_b0;
                    plVar1 = &(data->req).headerbytecount;
                    *plVar1 = *plVar1 + local_b0;
                    iVar6 = 1;
                    if (CVar5 == CURLE_OK) {
                      if ((*local_a0 == '\r') || (*local_a0 == '\n')) {
                        if (((data->req).httpcode == 0x197) && ((data->state).authproblem == false))
                        {
                          if (local_90 == 0) {
                            if ((local_50 & 1) == 0) {
                              bVar14 = 0;
                              local_90 = 0;
                            }
                            else {
                              (data->req).ignorebody = true;
                              Curl_infof(data,"%zd bytes of chunk left\n",gotbytes - lVar10);
                              pcVar8 = local_a0 + 1;
                              if (*pcVar8 == '\n') {
                                local_a0 = local_a0 + 1;
                              }
                              iVar15 = iVar15 + (uint)(*pcVar8 == '\n');
                              CVar7 = Curl_httpchunk_read(conn,local_a0 + 1,gotbytes - iVar15,
                                                          &gotbytes);
                              if (CVar7 == CHUNKE_STOP) {
                                bVar14 = 0;
                                Curl_infof(data,"chunk reading DONE\n");
                                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                              }
                              else {
                                Curl_infof(data,"Read %zd bytes of chunk, continue\n",gotbytes);
                                bVar14 = 2;
                              }
                              local_90 = 0;
                            }
                          }
                          else {
                            Curl_infof(data,"Ignore %ld bytes of response-body\n",local_90);
                            local_90 = local_90 + (lVar10 - gotbytes);
                            bVar14 = (0 < local_90) * '\x02';
                          }
                        }
                        else {
                          bVar14 = 0;
                          if (((data->info).httpproxycode == 200) && (gotbytes != iVar15 + 1)) {
                            bVar14 = 0;
                            Curl_failf(data,
                                       "Proxy CONNECT followed by %zd bytes of opaque data. Data ignored (known bug #39)"
                                      );
                          }
                        }
                        conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                        iVar6 = 0xd;
                        uVar18 = 0;
                        pcVar8 = local_70;
                        CVar5 = local_cc;
                      }
                      else {
                        cVar2 = local_a0[local_b0];
                        local_a0[local_b0] = '\0';
                        iVar6 = Curl_raw_nequal("WWW-Authenticate:",local_a0,0x11);
                        conn = local_60;
                        if (((iVar6 == 0) || ((data->req).httpcode != 0x191)) &&
                           ((iVar6 = Curl_raw_nequal("Proxy-authenticate:",local_a0,0x13),
                            iVar6 == 0 || ((data->req).httpcode != 0x197)))) {
                          iVar6 = Curl_raw_nequal("Content-Length:",local_a0,0xf);
                          if (iVar6 == 0) {
                            _Var4 = Curl_compareheader(local_a0,"Connection:","close");
                            if (_Var4) {
LAB_004931dc:
                              bVar3 = true;
                            }
                            else {
                              _Var4 = Curl_compareheader(local_a0,"Transfer-Encoding:","chunked");
                              if (_Var4) {
                                Curl_infof(data,"CONNECT responded chunked\n");
                                Curl_httpchunk_init(conn);
                                local_50 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                              }
                              else {
                                _Var4 = Curl_compareheader(local_a0,"Proxy-Connection:","close");
                                if (_Var4) goto LAB_004931dc;
                                iVar6 = __isoc99_sscanf(local_a0,"HTTP/1.%d %d",&subversion,local_40
                                                       );
                                if (iVar6 == 2) {
                                  (data->info).httpproxycode = (data->req).httpcode;
                                }
                              }
                            }
                          }
                          else {
                            local_90 = strtol(local_a0 + 0xf,(char **)0x0,10);
                          }
                        }
                        else {
                          iVar6 = (data->req).httpcode;
                          pcVar11 = Curl_copy_header_value(local_a0);
                          if (pcVar11 == (char *)0x0) {
                            local_cc = CURLE_OUT_OF_MEMORY;
                            bVar19 = false;
                          }
                          else {
                            CVar5 = Curl_http_input_auth(conn,iVar6 == 0x197,pcVar11);
                            (*Curl_cfree)(pcVar11);
                            bVar19 = CVar5 == CURLE_OK;
                            if (!bVar19) {
                              local_cc = CVar5;
                            }
                          }
                          iVar6 = 1;
                          CVar5 = local_cc;
                          if (!bVar19) goto LAB_00493282;
                        }
                        local_a0[local_b0] = cVar2;
                        local_a0 = pcVar8 + 1;
                        iVar6 = 0;
                        local_b0 = 0;
                        CVar5 = local_cc;
                      }
                    }
LAB_00493282:
                    local_cc = CVar5;
                    if (iVar6 != 0) {
                      if (iVar6 != 0xd) goto LAB_004933e9;
                      break;
                    }
                  }
                  pcVar8 = pcVar8 + 1;
                  iVar15 = iVar15 + 1;
                  lVar10 = (long)iVar15;
                } while (lVar10 < gotbytes);
                iVar6 = 0;
              }
            }
            else if (local_90 == 0) {
              tookcareof = 0;
              CVar7 = Curl_httpchunk_read(conn,local_70,gotbytes,&tookcareof);
              if (CVar7 == CHUNKE_STOP) {
                bVar14 = 0;
                Curl_infof(data,"chunk reading DONE\n");
                conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
              }
              else {
                Curl_infof(data,"Read %zd bytes of chunk, continue\n",tookcareof);
              }
              iVar6 = 0;
              uVar18 = 0;
              local_90 = 0;
              pcVar8 = local_70;
            }
            else {
              lVar10 = local_90 - gotbytes;
              if (lVar10 == 0 || local_90 < gotbytes) {
                bVar14 = 0;
              }
              iVar6 = 0;
              if (lVar10 < 1) {
                iVar6 = 10;
              }
              uVar18 = 0;
              pcVar8 = local_70;
              local_90 = lVar10;
            }
LAB_004933e9:
            if ((iVar6 != 10) && (iVar6 != 0)) goto LAB_004934b5;
          }
        }
        else {
          bVar14 = 0;
        }
LAB_00492e0a:
        iVar6 = Curl_pgrsUpdate(conn);
      } while (iVar6 == 0);
      local_cc = CURLE_ABORTED_BY_CALLBACK;
LAB_00493456:
      iVar6 = 1;
LAB_004934b5:
      if (iVar6 != 0) {
        if (iVar6 != 2) {
          return local_cc;
        }
        break;
      }
      if (((data->req).newurl != (char *)0x0) && (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE))
      {
        conn->tunnel_state[sockindex] = TUNNEL_INIT;
        Curl_infof(data,"TUNNEL_STATE switched to: %d\n",0);
      }
    } while ((data->req).newurl != (char *)0x0);
    if ((data->req).httpcode == 200) {
      conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
      pcVar8 = (conn->allocptr).proxyuserpwd;
      if (pcVar8 != (char *)0x0) {
        (*Curl_cfree)(pcVar8);
        (conn->allocptr).proxyuserpwd = (char *)0x0;
      }
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.done = true;
      Curl_infof(data,"Proxy replied OK to CONNECT request\n");
      (data->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
      return CURLE_OK;
    }
    if ((bVar3) && ((data->req).newurl != (char *)0x0)) {
      (conn->bits).proxy_connect_closed = true;
      Curl_infof(data,"Connect me again please\n");
    }
    else {
      pcVar8 = (data->req).newurl;
      if (pcVar8 != (char *)0x0) {
        (*Curl_cfree)(pcVar8);
        (data->req).newurl = (char *)0x0;
      }
      (conn->bits).close = true;
      Curl_closesocket(conn,conn->sock[sockindex]);
      conn->sock[sockindex] = -1;
    }
    conn->tunnel_state[sockindex] = TUNNEL_INIT;
    if ((conn->bits).proxy_connect_closed == false) {
      Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                 (ulong)(uint)(data->req).httpcode);
      return CURLE_RECV_ERROR;
    }
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  int subversion=0;
  struct SessionHandle *data=conn->data;
  struct SingleRequest *k = &data->req;
  CURLcode result;
  curl_socket_t tunnelsocket = conn->sock[sockindex];
  curl_off_t cl=0;
  bool closeConnection = FALSE;
  bool chunked_encoding = FALSE;
  long check;

#define SELECT_OK      0
#define SELECT_ERROR   1
#define SELECT_TIMEOUT 2
  int error = SELECT_OK;

  if(conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)
    return CURLE_OK; /* CONNECT is already completed */

  conn->bits.proxy_connect_closed = FALSE;

  do {
    if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
      /* BEGIN CONNECT PHASE */
      char *host_port;
      Curl_send_buffer *req_buffer;

      infof(data, "Establish HTTP proxy tunnel to %s:%hu\n",
            hostname, remote_port);

      if(data->req.newurl) {
        /* This only happens if we've looped here due to authentication
           reasons, and we don't really use the newly cloned URL here
           then. Just free() it. */
        free(data->req.newurl);
        data->req.newurl = NULL;
      }

      /* initialize a dynamic send-buffer */
      req_buffer = Curl_add_buffer_init();

      if(!req_buffer)
        return CURLE_OUT_OF_MEMORY;

      host_port = aprintf("%s:%hu", hostname, remote_port);
      if(!host_port) {
        free(req_buffer);
        return CURLE_OUT_OF_MEMORY;
      }

      /* Setup the proxy-authorization header, if any */
      result = Curl_http_output_auth(conn, "CONNECT", host_port, TRUE);

      free(host_port);

      if(CURLE_OK == result) {
        char *host=(char *)"";
        const char *proxyconn="";
        const char *useragent="";
        const char *http = (conn->proxytype == CURLPROXY_HTTP_1_0) ?
          "1.0" : "1.1";
        char *hostheader= /* host:port with IPv6 support */
          aprintf("%s%s%s:%hu", conn->bits.ipv6_ip?"[":"",
                  hostname, conn->bits.ipv6_ip?"]":"",
                  remote_port);
        if(!hostheader) {
          free(req_buffer);
          return CURLE_OUT_OF_MEMORY;
        }

        if(!Curl_checkProxyheaders(conn, "Host:")) {
          host = aprintf("Host: %s\r\n", hostheader);
          if(!host) {
            free(hostheader);
            free(req_buffer);
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if(!Curl_checkProxyheaders(conn, "Proxy-Connection:"))
          proxyconn = "Proxy-Connection: Keep-Alive\r\n";

        if(!Curl_checkProxyheaders(conn, "User-Agent:") &&
           data->set.str[STRING_USERAGENT])
          useragent = conn->allocptr.uagent;

        result =
          Curl_add_bufferf(req_buffer,
                           "CONNECT %s HTTP/%s\r\n"
                           "%s"  /* Host: */
                           "%s"  /* Proxy-Authorization */
                           "%s"  /* User-Agent */
                           "%s", /* Proxy-Connection */
                           hostheader,
                           http,
                           host,
                           conn->allocptr.proxyuserpwd?
                           conn->allocptr.proxyuserpwd:"",
                           useragent,
                           proxyconn);

        if(host && *host)
          free(host);
        free(hostheader);

        if(CURLE_OK == result)
          result = Curl_add_custom_headers(conn, TRUE, req_buffer);

        if(CURLE_OK == result)
          /* CRLF terminate the request */
          result = Curl_add_bufferf(req_buffer, "\r\n");

        if(CURLE_OK == result) {
          /* Send the connect request to the proxy */
          /* BLOCKING */
          result =
            Curl_add_buffer_send(req_buffer, conn,
                                 &data->info.request_size, 0, sockindex);
        }
        req_buffer = NULL;
        if(result)
          failf(data, "Failed sending CONNECT to proxy");
      }

      Curl_safefree(req_buffer);
      if(result)
        return result;

      conn->tunnel_state[sockindex] = TUNNEL_CONNECT;
    } /* END CONNECT PHASE */

    check = Curl_timeleft(data, NULL, TRUE);
    if(check <= 0) {
      failf(data, "Proxy CONNECT aborted due to timeout");
      return CURLE_RECV_ERROR;
    }

    if(0 == Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD, 0))
      /* return so we'll be called again polling-style */
      return CURLE_OK;
    else {
      DEBUGF(infof(data,
                   "Read response immediately from proxy CONNECT\n"));
    }

    /* at this point, the tunnel_connecting phase is over. */

    { /* READING RESPONSE PHASE */
      size_t nread;   /* total size read */
      int perline; /* count bytes per line */
      int keepon=TRUE;
      ssize_t gotbytes;
      char *ptr;
      char *line_start;

      ptr=data->state.buffer;
      line_start = ptr;

      nread=0;
      perline=0;
      keepon=TRUE;

      while((nread<BUFSIZE) && (keepon && !error)) {

        check = Curl_timeleft(data, NULL, TRUE);
        if(check <= 0) {
          failf(data, "Proxy CONNECT aborted due to timeout");
          error = SELECT_TIMEOUT; /* already too little time */
          break;
        }

        /* loop every second at least, less if the timeout is near */
        switch (Curl_socket_ready(tunnelsocket, CURL_SOCKET_BAD,
                                  check<1000L?check:1000)) {
        case -1: /* select() error, stop reading */
          error = SELECT_ERROR;
          failf(data, "Proxy CONNECT aborted due to select/poll error");
          break;
        case 0: /* timeout */
          break;
        default:
          DEBUGASSERT(ptr+BUFSIZE-nread <= data->state.buffer+BUFSIZE+1);
          result = Curl_read(conn, tunnelsocket, ptr, BUFSIZE-nread,
                             &gotbytes);
          if(result==CURLE_AGAIN)
            continue; /* go loop yourself */
          else if(result)
            keepon = FALSE;
          else if(gotbytes <= 0) {
            keepon = FALSE;
            if(data->set.proxyauth && data->state.authproxy.avail) {
              /* proxy auth was requested and there was proxy auth available,
                 then deem this as "mere" proxy disconnect */
              conn->bits.proxy_connect_closed = TRUE;
              infof(data, "Proxy CONNECT connection closed");
            }
            else {
              error = SELECT_ERROR;
              failf(data, "Proxy CONNECT aborted");
            }
          }
          else {
            /*
             * We got a whole chunk of data, which can be anything from one
             * byte to a set of lines and possibly just a piece of the last
             * line.
             */
            int i;

            nread += gotbytes;

            if(keepon > TRUE) {
              /* This means we are currently ignoring a response-body */

              nread = 0; /* make next read start over in the read buffer */
              ptr=data->state.buffer;
              if(cl) {
                /* A Content-Length based body: simply count down the counter
                   and make sure to break out of the loop when we're done! */
                cl -= gotbytes;
                if(cl<=0) {
                  keepon = FALSE;
                  break;
                }
              }
              else {
                /* chunked-encoded body, so we need to do the chunked dance
                   properly to know when the end of the body is reached */
                CHUNKcode r;
                ssize_t tookcareof=0;

                /* now parse the chunked piece of data so that we can
                   properly tell when the stream ends */
                r = Curl_httpchunk_read(conn, ptr, gotbytes, &tookcareof);
                if(r == CHUNKE_STOP) {
                  /* we're done reading chunks! */
                  infof(data, "chunk reading DONE\n");
                  keepon = FALSE;
                  /* we did the full CONNECT treatment, go COMPLETE */
                  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                }
                else
                  infof(data, "Read %zd bytes of chunk, continue\n",
                        tookcareof);
              }
            }
            else
              for(i = 0; i < gotbytes; ptr++, i++) {
                perline++; /* amount of bytes in this line so far */
                if(*ptr == 0x0a) {
                  char letter;
                  int writetype;

                  /* convert from the network encoding */
                  result = Curl_convert_from_network(data, line_start,
                                                     perline);
                  /* Curl_convert_from_network calls failf if unsuccessful */
                  if(result)
                    return result;

                  /* output debug if that is requested */
                  if(data->set.verbose)
                    Curl_debug(data, CURLINFO_HEADER_IN,
                               line_start, (size_t)perline, conn);

                  /* send the header to the callback */
                  writetype = CLIENTWRITE_HEADER;
                  if(data->set.include_header)
                    writetype |= CLIENTWRITE_BODY;

                  result = Curl_client_write(conn, writetype, line_start,
                                             perline);

                  data->info.header_size += (long)perline;
                  data->req.headerbytecount += (long)perline;

                  if(result)
                    return result;

                  /* Newlines are CRLF, so the CR is ignored as the line isn't
                     really terminated until the LF comes. Treat a following CR
                     as end-of-headers as well.*/

                  if(('\r' == line_start[0]) ||
                     ('\n' == line_start[0])) {
                    /* end of response-headers from the proxy */
                    nread = 0; /* make next read start over in the read
                                  buffer */
                    ptr=data->state.buffer;
                    if((407 == k->httpcode) && !data->state.authproblem) {
                      /* If we get a 407 response code with content length
                         when we have no auth problem, we must ignore the
                         whole response-body */
                      keepon = 2;

                      if(cl) {
                        infof(data, "Ignore %" CURL_FORMAT_CURL_OFF_T
                              " bytes of response-body\n", cl);

                        /* remove the remaining chunk of what we already
                           read */
                        cl -= (gotbytes - i);

                        if(cl<=0)
                          /* if the whole thing was already read, we are done!
                           */
                          keepon=FALSE;
                      }
                      else if(chunked_encoding) {
                        CHUNKcode r;
                        /* We set ignorebody true here since the chunked
                           decoder function will acknowledge that. Pay
                           attention so that this is cleared again when this
                           function returns! */
                        k->ignorebody = TRUE;
                        infof(data, "%zd bytes of chunk left\n", gotbytes-i);

                        if(line_start[1] == '\n') {
                          /* this can only be a LF if the letter at index 0
                             was a CR */
                          line_start++;
                          i++;
                        }

                        /* now parse the chunked piece of data so that we can
                           properly tell when the stream ends */
                        r = Curl_httpchunk_read(conn, line_start+1,
                                                  gotbytes -i, &gotbytes);
                        if(r == CHUNKE_STOP) {
                          /* we're done reading chunks! */
                          infof(data, "chunk reading DONE\n");
                          keepon = FALSE;
                          /* we did the full CONNECT treatment, go to
                             COMPLETE */
                          conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                        }
                        else
                          infof(data, "Read %zd bytes of chunk, continue\n",
                                gotbytes);
                      }
                      else {
                        /* without content-length or chunked encoding, we
                           can't keep the connection alive since the close is
                           the end signal so we bail out at once instead */
                        keepon=FALSE;
                      }
                    }
                    else {
                      keepon = FALSE;
                      if(200 == data->info.httpproxycode) {
                        if(gotbytes - (i+1))
                          failf(data, "Proxy CONNECT followed by %zd bytes "
                                "of opaque data. Data ignored (known bug #39)",
                                gotbytes - (i+1));
                      }
                    }
                    /* we did the full CONNECT treatment, go to COMPLETE */
                    conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;
                    break; /* breaks out of for-loop, not switch() */
                  }

                  /* keep a backup of the position we are about to blank */
                  letter = line_start[perline];
                  line_start[perline]=0; /* zero terminate the buffer */
                  if((checkprefix("WWW-Authenticate:", line_start) &&
                      (401 == k->httpcode)) ||
                     (checkprefix("Proxy-authenticate:", line_start) &&
                      (407 == k->httpcode))) {

                    bool proxy = (k->httpcode == 407) ? TRUE : FALSE;
                    char *auth = Curl_copy_header_value(line_start);
                    if(!auth)
                      return CURLE_OUT_OF_MEMORY;

                    result = Curl_http_input_auth(conn, proxy, auth);

                    Curl_safefree(auth);

                    if(result)
                      return result;
                  }
                  else if(checkprefix("Content-Length:", line_start)) {
                    cl = curlx_strtoofft(line_start +
                                         strlen("Content-Length:"), NULL, 10);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Connection:", "close"))
                    closeConnection = TRUE;
                  else if(Curl_compareheader(line_start,
                                             "Transfer-Encoding:",
                                             "chunked")) {
                    infof(data, "CONNECT responded chunked\n");
                    chunked_encoding = TRUE;
                    /* init our chunky engine */
                    Curl_httpchunk_init(conn);
                  }
                  else if(Curl_compareheader(line_start,
                                             "Proxy-Connection:", "close"))
                    closeConnection = TRUE;
                  else if(2 == sscanf(line_start, "HTTP/1.%d %d",
                                      &subversion,
                                      &k->httpcode)) {
                    /* store the HTTP code from the proxy */
                    data->info.httpproxycode = k->httpcode;
                  }
                  /* put back the letter we blanked out before */
                  line_start[perline]= letter;

                  perline=0; /* line starts over here */
                  line_start = ptr+1; /* this skips the zero byte we wrote */
                }
              }
          }
          break;
        } /* switch */
        if(Curl_pgrsUpdate(conn))
          return CURLE_ABORTED_BY_CALLBACK;
      } /* while there's buffer left and loop is requested */

      if(error)
        return CURLE_RECV_ERROR;

      if(data->info.httpproxycode != 200) {
        /* Deal with the possibly already received authenticate
           headers. 'newurl' is set to a new URL if we must loop. */
        result = Curl_http_auth_act(conn);
        if(result)
          return result;

        if(conn->bits.close)
          /* the connection has been marked for closure, most likely in the
             Curl_http_auth_act() function and thus we can kill it at once
             below
          */
          closeConnection = TRUE;
      }

      if(closeConnection && data->req.newurl) {
        /* Connection closed by server. Don't use it anymore */
        Curl_closesocket(conn, conn->sock[sockindex]);
        conn->sock[sockindex] = CURL_SOCKET_BAD;
        break;
      }
    } /* END READING RESPONSE PHASE */

    /* If we are supposed to continue and request a new URL, which basically
     * means the HTTP authentication is still going on so if the tunnel
     * is complete we start over in INIT state */
    if(data->req.newurl &&
       (TUNNEL_COMPLETE == conn->tunnel_state[sockindex])) {
      conn->tunnel_state[sockindex] = TUNNEL_INIT;
      infof(data, "TUNNEL_STATE switched to: %d\n",
            conn->tunnel_state[sockindex]);
    }

  } while(data->req.newurl);

  if(200 != data->req.httpcode) {
    if(closeConnection && data->req.newurl) {
      conn->bits.proxy_connect_closed = TRUE;
      infof(data, "Connect me again please\n");
    }
    else {
      if(data->req.newurl) {
        /* this won't be used anymore for the CONNECT so free it now */
        free(data->req.newurl);
        data->req.newurl = NULL;
      }
      /* failure, close this connection to avoid re-use */
      connclose(conn, "proxy CONNECT failure");
      Curl_closesocket(conn, conn->sock[sockindex]);
      conn->sock[sockindex] = CURL_SOCKET_BAD;
    }

    /* to back to init state */
    conn->tunnel_state[sockindex] = TUNNEL_INIT;

    if(conn->bits.proxy_connect_closed)
      /* this is not an error, just part of the connection negotiation */
      return CURLE_OK;
    else {
      failf(data, "Received HTTP code %d from proxy after CONNECT",
            data->req.httpcode);
      return CURLE_RECV_ERROR;
    }
  }

  conn->tunnel_state[sockindex] = TUNNEL_COMPLETE;

  /* If a proxy-authorization header was used for the proxy, then we should
     make sure that it isn't accidentally used for the document request
     after we've connected. So let's free and clear it here. */
  Curl_safefree(conn->allocptr.proxyuserpwd);
  conn->allocptr.proxyuserpwd = NULL;

  data->state.authproxy.done = TRUE;

  infof (data, "Proxy replied OK to CONNECT request\n");
  data->req.ignorebody = FALSE; /* put it (back) to non-ignore state */
  conn->bits.rewindaftersend = FALSE; /* make sure this isn't set for the
                                         document request  */
  return CURLE_OK;
}